

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Functional::BlendCase::iterate(BlendCase *this)

{
  TextureFormat TVar1;
  ReferenceQuadRenderer *pRVar2;
  RenderContext *context;
  TestLog *log;
  bool bVar3;
  int i;
  deUint32 dVar4;
  GLenum GVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  RenderTarget *pRVar9;
  long lVar10;
  int i_3;
  int iVar11;
  byte bVar12;
  IterateResult IVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  qpTestResult testResult;
  pointer pBVar17;
  Vector<unsigned_int,_4> res_2;
  Vector<unsigned_int,_4> res_1;
  UVec4 compareThreshold;
  TextureLevel referenceImg;
  TextureLevel renderedImg;
  Vector<unsigned_int,_4> res;
  PixelBufferAccess nullAccess;
  FragmentOperationState referenceState;
  Random rnd;
  ConstPixelBufferAccess local_378;
  ConstPixelBufferAccess local_348;
  uint local_31c;
  UVec4 local_318;
  TextureLevel local_308;
  TextureLevel local_2e0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  int aiStack_2a0 [4];
  uint auStack_290 [4];
  int aiStack_280 [4];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  _func_int **local_258;
  ios_base local_1e8 [264];
  FragmentOperationState local_e0;
  deRandom local_40;
  
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar15 = ((uint)this->m_curParamSetNdx >> 0x10 ^ this->m_curParamSetNdx ^ 0x3d) * 9;
  uVar15 = (uVar15 >> 4 ^ uVar15) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar15 >> 0xf ^ dVar4 ^ uVar15);
  iVar6 = this->m_renderWidth;
  iVar11 = this->m_viewportWidth;
  dVar4 = deRandom_getUint32(&local_40);
  uVar15 = dVar4 % ((iVar6 - iVar11) + 1U);
  iVar6 = this->m_renderHeight;
  iVar11 = this->m_viewportHeight;
  dVar4 = deRandom_getUint32(&local_40);
  uVar16 = dVar4 % ((iVar6 - iVar11) + 1U);
  local_260._0_4_ = RGBA;
  if (this->m_useSrgbFbo != false) {
    local_260._0_4_ = sRGBA;
  }
  local_260._4_4_ = UNORM_INT8;
  tcu::TextureLevel::TextureLevel
            (&local_2e0,(TextureFormat *)local_260,this->m_viewportWidth,this->m_viewportHeight,1);
  local_260._0_4_ = local_2e0.m_format.order;
  local_260._4_4_ = local_2e0.m_format.type;
  tcu::TextureLevel::TextureLevel
            (&local_308,(TextureFormat *)local_260,this->m_viewportWidth,this->m_viewportHeight,1);
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pBVar17 = (this->m_paramSets).
            super__Vector_base<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_curParamSetNdx;
  rr::FragmentOperationState::FragmentOperationState(&local_e0);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"RGB equation = ",0xf);
  pcVar7 = glu::getBlendEquationName(pBVar17->equationRGB);
  iVar6 = (int)(ostringstream *)&local_258;
  if (pcVar7 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar7,sVar8);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"RGB src func = ",0xf);
  pcVar7 = glu::getBlendFactorName(pBVar17->srcFuncRGB);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar7,sVar8);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"RGB dst func = ",0xf);
  pcVar7 = glu::getBlendFactorName(pBVar17->dstFuncRGB);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar7,sVar8);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Alpha equation = ",0x11)
  ;
  pcVar7 = glu::getBlendEquationName(pBVar17->equationAlpha);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar7,sVar8);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Alpha src func = ",0x11)
  ;
  pcVar7 = glu::getBlendFactorName(pBVar17->srcFuncAlpha);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar7,sVar8);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Alpha dst func = ",0x11)
  ;
  pcVar7 = glu::getBlendFactorName(pBVar17->dstFuncAlpha);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar7,sVar8);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Blend color = (",0xf);
  std::ostream::_M_insert<double>((double)(pBVar17->blendColor).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar17->blendColor).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar17->blendColor).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar17->blendColor).m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  glwBlendEquationSeparate(pBVar17->equationRGB,pBVar17->equationAlpha);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0x117);
  glwBlendFuncSeparate
            (pBVar17->srcFuncRGB,pBVar17->dstFuncRGB,pBVar17->srcFuncAlpha,pBVar17->dstFuncAlpha);
  GVar5 = glwGetError();
  glu::checkError(GVar5,
                  "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0x118);
  glwBlendColor((pBVar17->blendColor).m_data[0],(pBVar17->blendColor).m_data[1],
                (pBVar17->blendColor).m_data[2],(pBVar17->blendColor).m_data[3]);
  GVar5 = glwGetError();
  glu::checkError(GVar5,
                  "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0x119);
  local_e0.blendRGBState.equation = sglr::rr_util::mapGLBlendEquation(pBVar17->equationRGB);
  local_e0.blendRGBState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar17->srcFuncRGB);
  local_e0.blendRGBState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar17->dstFuncRGB);
  local_e0.blendAState.equation = sglr::rr_util::mapGLBlendEquation(pBVar17->equationAlpha);
  local_e0.blendAState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar17->srcFuncAlpha);
  local_e0.blendAState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar17->dstFuncAlpha);
  local_e0.blendColor.m_data._0_8_ = *(undefined8 *)(pBVar17->blendColor).m_data;
  local_e0.blendColor.m_data._8_8_ = *(undefined8 *)((pBVar17->blendColor).m_data + 2);
  glwDisable(0xbe2);
  glwViewport(uVar15,uVar16,this->m_viewportWidth,this->m_viewportHeight);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_260);
  local_e0.blendMode = BLENDMODE_NONE;
  pRVar2 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_348,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_378,(PixelBufferAccess *)&local_348);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,(PixelBufferAccess *)&local_378,(PixelBufferAccess *)local_260,
             (PixelBufferAccess *)local_260,&this->m_firstQuadInt,&local_e0);
  local_e0.blendMode = BLENDMODE_STANDARD;
  pRVar2 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_348,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_378,(PixelBufferAccess *)&local_348);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,(PixelBufferAccess *)&local_378,(PixelBufferAccess *)local_260,
             (PixelBufferAccess *)local_260,&this->m_secondQuadInt,&local_e0);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_378,&local_308);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_348,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_378,(EVP_PKEY_CTX *)&local_348);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_378,&local_2e0);
  glu::readPixels(context,uVar15,uVar16,(PixelBufferAccess *)&local_378);
  if (this->m_useSrgbFbo == true) {
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_378,&local_2e0);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_348,&local_2e0);
    sRGBAToLinear((PixelBufferAccess *)&local_378,&local_348);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_378,&local_308);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_348,&local_308);
    sRGBAToLinear((PixelBufferAccess *)&local_378,&local_348);
  }
  iVar6 = 8;
  bVar14 = 0;
  bVar12 = 0;
  uVar15 = 0;
  if (this->m_useSrgbFbo == false) {
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = (pRVar9->m_pixelFormat).alphaBits;
    bVar14 = 8 - (char)(pRVar9->m_pixelFormat).blueBits;
    bVar12 = 8 - (char)(pRVar9->m_pixelFormat).greenBits;
    uVar15 = 8 - (pRVar9->m_pixelFormat).redBits;
  }
  uVar16 = 0;
  if (0 < iVar6) {
    uVar16 = 0x1000000 << (8U - (char)iVar6 & 0x1f);
  }
  local_31c = 0x10000 << (bVar14 & 0x1f) | 0x100 << (bVar12 & 0x1f) | uVar16 | 1 << (uVar15 & 0x1f);
  tcu::RGBA::toIVec((RGBA *)&local_270);
  local_2b8 = local_270;
  uStack_2b0 = uStack_268;
  lVar10 = 0;
  do {
    aiStack_280[lVar10] = 5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_348.m_format.order = R;
  local_348.m_format.type = SNORM_INT8;
  local_348.m_size.m_data[0] = 0;
  local_348.m_size.m_data[1] = 0;
  lVar10 = 0;
  do {
    local_348.m_size.m_data[lVar10 + -2] =
         aiStack_280[lVar10] * *(int *)((long)&local_2b8 + lVar10 * 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    auStack_290[lVar10] = 2;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_378.m_format.order = R;
  local_378.m_format.type = SNORM_INT8;
  local_378.m_size.m_data[0] = 0;
  local_378.m_size.m_data[1] = 0;
  lVar10 = 0;
  do {
    local_378.m_size.m_data[lVar10 + -2] =
         (uint)local_348.m_size.m_data[lVar10 + -2] / auStack_290[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  bVar3 = this->m_useSrgbFbo;
  lVar10 = 0;
  do {
    aiStack_2a0[lVar10] = (uint)bVar3 + (uint)bVar3 * 2 + 2;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_318.m_data[0] = 0;
  local_318.m_data[1] = 0;
  local_318.m_data[2] = 0;
  local_318.m_data[3] = 0;
  lVar10 = 0;
  do {
    local_318.m_data[lVar10] = aiStack_2a0[lVar10] + local_378.m_size.m_data[lVar10 + -2];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_378,&local_308);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_348,&local_2e0);
  bVar3 = tcu::intThresholdCompare
                    (log,"CompareResult","Image Comparison Result",&local_378,&local_348,&local_318,
                     COMPARE_LOG_RESULT);
  if (bVar3) {
    iVar6 = this->m_curParamSetNdx + 1;
    this->m_curParamSetNdx = iVar6;
    iVar11 = (int)((ulong)((long)(this->m_paramSets).
                                 super__Vector_base<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_paramSets).
                                super__Vector_base<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    IVar13 = CONTINUE;
    if (SBORROW4(iVar6,iVar11 * -0x33333333) != iVar6 + iVar11 * 0x33333333 < 0) goto LAB_01211197;
    pcVar7 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    pcVar7 = "Image compare failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  IVar13 = STOP;
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,testResult,pcVar7);
LAB_01211197:
  tcu::TextureLevel::~TextureLevel(&local_308);
  tcu::TextureLevel::~TextureLevel(&local_2e0);
  return IVar13;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_renderWidth - m_viewportWidth);
	int								viewportY		= rnd.getInt(0, m_renderHeight - m_viewportHeight);
	TextureLevel					renderedImg		(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_viewportWidth, m_viewportHeight);
	TextureLevel					referenceImg	(renderedImg.getFormat(), m_viewportWidth, m_viewportHeight);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportWidth, m_viewportHeight);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Copy to reference (expansion to RGBA happens here if necessary)
	copy(referenceImg, m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.
	// \note In sRGB cases, convert to linear space for comparison.

	if (m_useSrgbFbo)
	{
		sRGBAToLinear(renderedImg, renderedImg);
		sRGBAToLinear(referenceImg, referenceImg);
	}

	UVec4 compareThreshold = (m_useSrgbFbo ? tcu::PixelFormat(8, 8, 8, 8) : m_context.getRenderTarget().getPixelFormat()).getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(m_useSrgbFbo ? 5 : 2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result",
												referenceImg.getAccess(), renderedImg.getAccess(),
												compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}